

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool wasm::ExpressionAnalyzer::shallowEqual(Expression *left,Expression *right)

{
  bool bVar1;
  ExprComparer local_48;
  undefined1 local_28 [8];
  anon_class_16_2_f7fedec0 comparer;
  Expression *right_local;
  Expression *left_local;
  
  local_28 = (undefined1  [8])left;
  comparer.left = right;
  comparer.right = right;
  std::function<bool(wasm::Expression*,wasm::Expression*)>::
  function<wasm::ExpressionAnalyzer::shallowEqual(wasm::Expression*,wasm::Expression*)::_lambda(wasm::Expression*,wasm::Expression*)_1_&,void>
            ((function<bool(wasm::Expression*,wasm::Expression*)> *)&local_48,
             (anon_class_16_2_f7fedec0 *)local_28);
  bVar1 = flexibleEqual(left,right,&local_48);
  std::function<bool_(wasm::Expression_*,_wasm::Expression_*)>::~function(&local_48);
  return bVar1;
}

Assistant:

static bool shallowEqual(Expression* left, Expression* right) {
    auto comparer = [left, right](Expression* currLeft, Expression* currRight) {
      if (currLeft == left && currRight == right) {
        // these are the ones we want to compare
        return false;
      }
      // otherwise, don't do the comparison, we don't care
      return true;
    };
    return flexibleEqual(left, right, comparer);
  }